

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tfloat
              (fitsfile *outfptr,long row,void *tiledata,long tilelen,long tilenx,long tileny,
              int nullcheck,void *nullflagval,int nullval,int zbitpix,double scale,double zero,
              int *intlength,int *flag,double *bscale,double *bzero,int *status)

{
  float fVar1;
  int iVar2;
  time_t tVar3;
  ulong uVar4;
  int local_98 [2];
  int imaxval;
  int iminval;
  unsigned_long dithersum;
  uchar *usbbuff;
  long lStack_78;
  float floatnull;
  long ii;
  long irow;
  int *idata;
  double zero_local;
  double scale_local;
  long tileny_local;
  long tilenx_local;
  long tilelen_local;
  void *tiledata_local;
  long row_local;
  fitsfile *outfptr_local;
  
  local_98[1] = 0;
  local_98[0] = 0;
  idata = (int *)zero;
  zero_local = scale;
  scale_local = (double)tileny;
  tileny_local = tilenx;
  tilenx_local = tilelen;
  tilelen_local = (long)tiledata;
  tiledata_local = (void *)row;
  row_local = (long)outfptr;
  if (((((zbitpix != 0x20) && (zbitpix != -0x40)) && (zbitpix != -0x20)) ||
      ((scale != 1.0 || (NAN(scale))))) || ((zero != 0.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    outfptr_local._4_4_ = 0x19d;
  }
  else {
    *intlength = 4;
    irow = (long)tiledata;
    if (outfptr->Fptr->cn_zscale < 1) {
      fVar1 = outfptr->Fptr->quantize_level;
      if ((fVar1 != 9999.0) || (NAN(fVar1))) {
        if ((scale != 1.0) || (((NAN(scale) || (zero != 0.0)) || (NAN(zero))))) {
          imcomp_nullscalefloats
                    ((float *)tiledata,tilelen,(int *)tiledata,scale,zero,nullcheck,*nullflagval,
                     nullval,status);
        }
        else {
          imcomp_nullfloats((float *)tiledata,tilelen,(int *)tiledata,nullcheck,*nullflagval,nullval
                            ,status);
        }
      }
      else {
        fVar1 = outfptr->Fptr->quantize_level;
        if (((fVar1 == 9999.0) && (!NAN(fVar1))) && (nullcheck == 1)) {
          imcomp_float2nan((float *)tiledata,tilelen,(int *)tiledata,*nullflagval,status);
        }
      }
    }
    else {
      if (nullcheck == 1) {
        usbbuff._4_4_ = *nullflagval;
      }
      else {
        usbbuff._4_4_ = -9.11912e-36;
      }
      if ((outfptr->Fptr->quantize_method == 1) || (outfptr->Fptr->quantize_method == 2)) {
        if ((outfptr->Fptr->request_dither_seed == 0) && (outfptr->Fptr->dither_seed == 0)) {
          tVar3 = time((time_t *)0x0);
          uVar4 = clock();
          *(int *)(*(long *)(row_local + 8) + 0x478) =
               ((int)tVar3 +
                (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 10000
                     ) + *(int *)(*(long *)(row_local + 8) + 0x54)) % 10000 + 1;
          ffuky((fitsfile *)row_local,0x1f,"ZDITHER0",(void *)(*(long *)(row_local + 8) + 0x478),
                (char *)0x0,status);
        }
        else if ((outfptr->Fptr->request_dither_seed < 0) && (outfptr->Fptr->dither_seed < 0)) {
          _imaxval = 0;
          for (lStack_78 = 0; lStack_78 < tilelen * 4; lStack_78 = lStack_78 + 1) {
            _imaxval = *(byte *)((long)tiledata + lStack_78) + _imaxval;
          }
          outfptr->Fptr->dither_seed = (int)(_imaxval % 10000) + 1;
          dithersum = (unsigned_long)tiledata;
          ffuky(outfptr,0x1f,"ZDITHER0",&outfptr->Fptr->dither_seed,(char *)0x0,status);
        }
        ii = (long)tiledata_local + (long)*(int *)(*(long *)(row_local + 8) + 0x478) + -1;
      }
      else {
        if (outfptr->Fptr->quantize_method != -1) {
          ffpmsg("Unknown dithering method.");
          ffpmsg("May need to install a newer version of CFITSIO.");
          *status = 0x19d;
          return 0x19d;
        }
        ii = 0;
      }
      iVar2 = fits_quantize_float(ii,(float *)tilelen_local,tileny_local,(long)scale_local,nullcheck
                                  ,usbbuff._4_4_,*(float *)(*(long *)(row_local + 8) + 0x470),
                                  *(int *)(*(long *)(row_local + 8) + 0x474),(int *)irow,bscale,
                                  bzero,local_98 + 1,local_98);
      *flag = iVar2;
      if (1 < *flag) {
        iVar2 = *flag;
        *status = iVar2;
        return iVar2;
      }
    }
    outfptr_local._4_4_ = *status;
  }
  return outfptr_local._4_4_;
}

Assistant:

int imcomp_convert_tile_tfloat(
    fitsfile *outfptr,
    long row,
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *flag,
    double *bscale,
    double *bzero,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input float tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int *idata;
    long irow, ii;
    float floatnull;
    unsigned char *usbbuff;
    unsigned long dithersum;
    int iminval = 0, imaxval = 0;  /* min and max quantized integers */

        /* datatype of input array is double.  We only support writing this datatype
           to a FITS image with BITPIX = -64 or -32, except we also support the special case where
	   BITPIX = 32 and BZERO = 0 and BSCALE = 1.  */

       if ((zbitpix != LONG_IMG && zbitpix != DOUBLE_IMG && zbitpix != FLOAT_IMG) || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

           *intlength = 4;
           idata = (int *) tiledata;

          /* if the tile-compressed table contains zscale and zzero columns */
          /* then scale and quantize the input floating point data.    */

          if ((outfptr->Fptr)->cn_zscale > 0) {
	    /* quantize the float values into integers */

            if (nullcheck == 1)
	      floatnull = *(float *) (nullflagval);
	    else
	      floatnull = FLOATNULLVALUE;  /* NaNs are represented by this, by default */

            if ((outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_1  ||
	        (outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_2) {
	      
	          /* see if the dithering offset value needs to be initialized */                  
	          if ((outfptr->Fptr)->request_dither_seed == 0 && (outfptr->Fptr)->dither_seed == 0) {

		     /* This means randomly choose the dithering offset based on the system time. */
		     /* The offset will have a value between 1 and 10000, inclusive. */
		     /* The time function returns an integer value that is incremented each second. */
		     /* The clock function returns the elapsed CPU time, in integer CLOCKS_PER_SEC units. */
		     /* The CPU time returned by clock is typically (on linux PC) only good to 0.01 sec */
		     /* Summing the 2 quantities may help avoid cases where 2 executions of the program */
		     /* (perhaps in a multithreaded environoment) end up with exactly the same dither seed */
		     /* value.  The sum is incremented by the current HDU number in the file to provide */
		     /* further randomization.  This randomization is desireable if multiple compressed */
		     /* images will be summed (or differenced). In such cases, the benefits of dithering */
		     /* may be lost if all the images use exactly the same sequence of random numbers when */
		     /* calculating the dithering offsets. */	     
		     
		     (outfptr->Fptr)->dither_seed = 
		       (( (int)time(NULL) + ( (int) clock() / (int) (CLOCKS_PER_SEC / 100)) + (outfptr->Fptr)->curhdu) % 10000) + 1;
		     
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);

	          } else if ((outfptr->Fptr)->request_dither_seed < 0 && (outfptr->Fptr)->dither_seed < 0) {

		     /* this means randomly choose the dithering offset based on some hash function */
		     /* of the first input tile of data to be quantized and compressed.  This ensures that */
                     /* the same offset value is used for a given image every time it is compressed. */

		     usbbuff = (unsigned char *) tiledata;
		     dithersum = 0;
		     for (ii = 0; ii < 4 * tilelen; ii++) {
		         dithersum += usbbuff[ii];  /* doesn't matter if there is an integer overflow */
	             }
		     (outfptr->Fptr)->dither_seed = ((int) (dithersum % 10000)) + 1;
		
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);
		  }

                  /* subtract 1 to convert from 1-based to 0-based element number */
	          irow = row + (outfptr->Fptr)->dither_seed - 1; /* dither the quantized values */

	      } else if ((outfptr->Fptr)->quantize_method == -1) {
	          irow = 0;  /* do not dither the quantized values */
              } else {
                  ffpmsg("Unknown dithering method.");
                  ffpmsg("May need to install a newer version of CFITSIO.");
                  return(*status = DATA_COMPRESSION_ERR);
              }

              *flag = fits_quantize_float (irow, (float *) tiledata, tilenx, tileny,
                   nullcheck, floatnull, (outfptr->Fptr)->quantize_level, 
		   (outfptr->Fptr)->quantize_method, idata, bscale, bzero, &iminval, &imaxval);

              if (*flag > 1)
		   return(*status = *flag);
          }
          else if ((outfptr->Fptr)->quantize_level != NO_QUANTIZE)
	  {
	    /* if floating point pixels are not being losslessly compressed, then */
	    /* input float data is implicitly converted (truncated) to integers */
            if ((scale != 1. || zero != 0.))  /* must scale the values */
	       imcomp_nullscalefloats((float *) tiledata, tilelen, idata, scale, zero,
	           nullcheck, *(float *) (nullflagval), nullval, status);
             else
	       imcomp_nullfloats((float *) tiledata, tilelen, idata,
	           nullcheck, *(float *) (nullflagval), nullval,  status);
          }
          else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE)
	  {
	      /* just convert null values to NaNs in place, if necessary, then do lossless gzip compression */
		if (nullcheck == 1) {
	            imcomp_float2nan((float *) tiledata, tilelen, (int *) tiledata,
	                *(float *) (nullflagval), status);
		}
          }

          return(*status);
}